

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

string * __thiscall
MdlOptions::output_file_abi_cxx11_(string *__return_storage_ptr__,MdlOptions *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_output_file);
  return __return_storage_ptr__;
}

Assistant:

std::string MdlOptions::output_file() const {
	return _output_file;
}